

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68k-dis.c
# Opt level: O2

int print_insn_arg(char *d,uchar *buffer,uchar *p0,bfd_vma addr,disassemble_info *info)

{
  byte bVar1;
  byte bVar2;
  uchar uVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  char **ppcVar7;
  fprintf_ftype p_Var8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  char *pcVar12;
  char *pcVar13;
  bfd_vma bVar14;
  FILE *pFVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  bfd_byte *pbVar20;
  bool bVar21;
  uint uStack_50;
  double flval;
  
  bVar1 = *d;
  uVar9 = bVar1 - 0x21;
  if (0x5d < uVar9) {
LAB_0012f231:
    return -2;
  }
  bVar2 = d[1];
  iVar18 = (int)(char)bVar2;
  pbVar20 = p0;
  switch(uVar9) {
  default:
    if (bVar2 == 100) {
      uVar5 = *buffer >> 1 & 7 | (ushort)(CONCAT11(*buffer,buffer[1]) >> 3) & 0x38;
    }
    else {
      uVar5 = buffer[1] & 0x3f;
    }
    switch(bVar1) {
    case 0x62:
      uStack_50 = 0x23d;
      break;
    case 99:
    case 100:
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x72:
    case 0x73:
    case 0x74:
    case 0x75:
    case 0x78:
    case 0x7b:
    case 0x7d:
switchD_0012df19_caseD_63:
      abort();
    case 0x6d:
      uStack_50 = 0x1f;
      break;
    case 0x6e:
      uStack_50 = 0x220;
      break;
    case 0x6f:
      uStack_50 = 0xdc0;
      break;
    case 0x70:
      uStack_50 = 0x3f;
      break;
    case 0x71:
      uStack_50 = 0x3d;
      break;
    case 0x76:
      uStack_50 = 0x1bd;
      break;
    case 0x77:
      uStack_50 = 0x23c;
      break;
    case 0x79:
      uStack_50 = 0x24;
      break;
    case 0x7a:
      uStack_50 = 0x224;
      break;
    case 0x7c:
switchD_0012df19_caseD_7c:
      uStack_50 = 0x7e4;
      break;
    case 0x7e:
      uStack_50 = 0x1fc;
      break;
    default:
      switch(uVar9) {
      case 0:
        goto switchD_0012df19_caseD_7c;
      case 1:
      case 2:
      case 6:
      case 7:
      case 8:
      case 10:
      case 0xb:
      case 0xc:
      case 0xd:
        goto switchD_0012df19_caseD_63;
      case 3:
        uStack_50 = 0x1fd;
        break;
      case 4:
        uStack_50 = 0x1ff;
        break;
      case 5:
        uStack_50 = 0x1e4;
        break;
      case 9:
        uStack_50 = 0xfff;
        break;
      case 0xe:
        uStack_50 = 0x7e5;
        break;
      default:
        switch(bVar1) {
        case 0x34:
          uStack_50 = 0x3c;
          break;
        default:
          goto switchD_0012df19_caseD_63;
        case 0x3b:
          uStack_50 = 0xffd;
          break;
        case 0x3c:
          uStack_50 = 0x7ec;
          break;
        case 0x3e:
          uStack_50 = 500;
          break;
        case 0x3f:
          uStack_50 = 0x1e5;
          break;
        case 0x40:
          uStack_50 = 0x7fd;
        }
      }
    }
    uVar16 = uVar5 >> 3;
    uVar9 = (uVar5 & 7) + 7;
    if (uVar16 != 7) {
      uVar9 = uVar16;
    }
    if ((uStack_50 >> uVar9 & 1) != 0) {
      iVar18 = (*(code *)(&DAT_0033cc34 + *(int *)(&DAT_0033cc34 + (ulong)uVar16 * 4)))
                         ((uVar5 & 7) + 8,
                          &DAT_0033cc34 + *(int *)(&DAT_0033cc34 + (ulong)uVar16 * 4));
      return iVar18;
    }
    return -1;
  case 1:
  case 6:
  case 7:
  case 8:
  case 0xb:
  case 0xd:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1c:
  case 0x2d:
  case 0x2f:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3f:
  case 0x47:
  case 0x5a:
  case 0x5c:
    goto LAB_0012f231;
  case 2:
  case 0x3d:
    bVar21 = bVar1 != 0x23;
    if (bVar2 == 0x33) {
      iVar18 = 0x33;
      iVar6 = 8;
LAB_0012ec0f:
      uVar9 = fetch_arg(buffer,iVar18,iVar6,info);
      if ((int)uVar9 < 0) {
        return -3;
      }
      uVar10 = (ulong)uVar9;
    }
    else {
      if (bVar2 == 0x38) {
        iVar18 = 0x38;
        iVar6 = 3;
        goto LAB_0012ec0f;
      }
      if (bVar2 == 0x43) {
        iVar18 = 0x43;
        iVar6 = 7;
        goto LAB_0012ec0f;
      }
      if (bVar2 == 0x62) {
        if ((*info->private_data < buffer + (ulong)bVar21 * 2 + 4) &&
           (iVar18 = fetch_data(info,buffer + (ulong)bVar21 * 2 + 4), iVar18 == 0)) {
          return -3;
        }
        uVar10 = (ulong)(uint)(int)(char)buffer[(ulong)bVar21 * 2 + 3];
      }
      else if (bVar2 == 0x73) {
        uVar10 = (ulong)(buffer[1] & 0xf);
      }
      else if ((bVar2 & 0xdf) == 0x57) {
        if ((*info->private_data < buffer + (ulong)bVar21 * 2 + 4) &&
           (iVar18 = fetch_data(info,buffer + (ulong)bVar21 * 2 + 4), iVar18 == 0)) {
          return -3;
        }
        uVar10 = (ulong)(uint)((int)((uint)buffer[(ulong)bVar21 * 2 + 3] << 0x10 |
                                    (uint)(byte)*(uint *)(buffer + (ulong)bVar21 * 2 + 2) << 0x18)
                              >> 0x10);
      }
      else {
        if (bVar2 != 0x6c) {
          return -2;
        }
        if ((*info->private_data < buffer + (ulong)bVar21 * 2 + 6) &&
           (iVar18 = fetch_data(info,buffer + (ulong)bVar21 * 2 + 6), iVar18 == 0)) {
          return -3;
        }
        uVar9 = *(uint *)(buffer + (ulong)bVar21 * 2 + 2);
        uVar10 = (ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                        uVar9 << 0x18);
      }
    }
    pFVar15 = info->stream;
    pcVar12 = "#%d";
LAB_0012ec36:
    (*info->fprintf_func)(pFVar15,pcVar12,uVar10);
    break;
  case 10:
    uVar9 = fetch_arg(buffer,iVar18,3,info);
    if ((int)uVar9 < 0) {
      return -3;
    }
    pFVar15 = info->stream;
    pcVar12 = reg_names[(ulong)uVar9 + 8];
    pcVar13 = "(%s)+";
    goto LAB_0012eb6a;
  case 0xc:
    uVar9 = fetch_arg(buffer,iVar18,3,info);
    if ((int)uVar9 < 0) {
      return -3;
    }
    pFVar15 = info->stream;
    pcVar12 = reg_names[(ulong)uVar9 + 8];
    pcVar13 = "-(%s)";
    goto LAB_0012eb6a;
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x36:
  case 0x38:
  case 0x39:
    goto LAB_0012df47;
  case 0x20:
    uVar9 = fetch_arg(buffer,iVar18,3,info);
    if ((int)uVar9 < 0) {
      return -3;
    }
    pFVar15 = info->stream;
    pcVar12 = reg_names[(ulong)uVar9 + 8];
    goto LAB_0012eb63;
  case 0x21:
    if (bVar2 == 0x42) {
      uVar9 = (uint)(char)buffer[1];
    }
    else if (bVar2 == 0x62) {
      pbVar20 = p0 + 2;
      if ((*info->private_data < pbVar20) && (iVar18 = fetch_data(info,pbVar20), iVar18 == 0)) {
        return -3;
      }
      uVar9 = (uint)(char)p0[1];
    }
    else if ((bVar2 & 0xdf) == 0x57) {
      if (*info->private_data < p0 + 2) {
LAB_0012ec6f:
        iVar18 = fetch_data(info,p0 + 2);
        if (iVar18 == 0) {
          return -3;
        }
      }
LAB_0012ec8e:
      bVar1 = *p0;
      bVar2 = p0[1];
LAB_0012ec97:
      uVar9 = (int)((uint)bVar2 << 0x10 | (uint)bVar1 << 0x18) >> 0x10;
      pbVar20 = p0 + 2;
    }
    else {
      if ((bVar2 == 0x43) || (bVar2 == 0x6c)) {
LAB_0012efe9:
        if (*info->private_data < p0 + 4) {
LAB_0012eff5:
          iVar18 = fetch_data(info,p0 + 4);
          if (iVar18 == 0) {
            return -3;
          }
        }
LAB_0012f014:
        uVar9 = *(uint *)p0;
      }
      else {
        if (bVar2 == 99) {
          if ((buffer[1] & 0x40) == 0) {
            if (*info->private_data < p0 + 2) goto LAB_0012ec6f;
            goto LAB_0012ec8e;
          }
          if (*info->private_data < p0 + 4) goto LAB_0012eff5;
          goto LAB_0012f014;
        }
        if (bVar2 != 0x67) {
          if (bVar2 != 0x4c) {
            return -2;
          }
          goto LAB_0012efe9;
        }
        if ((*info->private_data < buffer + 2) &&
           (iVar18 = fetch_data(info,buffer + 2), iVar18 == 0)) {
          return -3;
        }
        uVar3 = buffer[1];
        uVar9 = (uint)(char)uVar3;
        if (uVar3 == '\0') {
          if ((*info->private_data < p0 + 2) && (iVar18 = fetch_data(info,p0 + 2), iVar18 == 0)) {
            return -3;
          }
          bVar1 = *p0;
          bVar2 = p0[1];
          goto LAB_0012ec97;
        }
        if (uVar3 != 0xff) goto LAB_0012f019;
        if ((*info->private_data < p0 + 4) && (iVar18 = fetch_data(info,p0 + 4), iVar18 == 0)) {
          return -3;
        }
        uVar9 = *(uint *)p0;
      }
      uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
      pbVar20 = p0 + 4;
    }
LAB_0012f019:
    bVar14 = uVar9 + addr;
    goto LAB_0012f01b;
  case 0x22:
    pFVar15 = info->stream;
    pcVar12 = "ccr";
    goto LAB_0012e606;
  case 0x23:
    iVar6 = 3;
    goto LAB_0012e619;
  case 0x24:
    pFVar15 = info->stream;
    pcVar12 = "acc";
    goto LAB_0012e606;
  case 0x25:
    uVar9 = fetch_arg(buffer,iVar18,3,info);
    if ((int)uVar9 < 0) {
      return -3;
    }
    pFVar15 = info->stream;
    pcVar12 = "fp%d";
    goto LAB_0012e680;
  case 0x26:
    pFVar15 = info->stream;
    pcVar12 = "macsr";
    goto LAB_0012e606;
  case 0x27:
    pFVar15 = info->stream;
    pcVar12 = "mask";
    goto LAB_0012e606;
  case 0x28:
    if ((*buffer >> 1 & 7) != 1) {
      (*info->fprintf_func)(info->stream,"(cpid=%d) ");
    }
    break;
  case 0x29:
    uVar9 = (uint)info->mach;
    uVar5 = fetch_arg(buffer,iVar18,0xc,info);
    if ((int)uVar5 < 0) {
      return -3;
    }
    if (uVar9 < 0x11 || (uVar9 & 0xffffffe0) != 0) {
LAB_0012e120:
      uVar9 = 0xf;
      do {
        uVar16 = uVar9;
        if ((int)uVar16 < 0) {
          pFVar15 = info->stream;
          pcVar12 = "%d";
          uVar10 = (ulong)uVar5;
          goto LAB_0012ec36;
        }
        uVar9 = uVar16 - 1;
      } while (print_insn_arg::names[uVar16].value != uVar5);
      pFVar15 = info->stream;
      pcVar12 = print_insn_arg::names[uVar16].name;
    }
    else {
      lVar17 = 0x58;
      do {
        lVar11 = lVar17;
        if (lVar11 + -0x10 == -0x18) goto LAB_0012e120;
        lVar17 = lVar11 + -0x10;
      } while (*(uint *)((long)&print_insn_arg::names_v4e[0].name + lVar11) != uVar5);
      pFVar15 = info->stream;
      pcVar12 = *(char **)((long)&print_insn_arg::names[0xf].value + lVar11);
    }
    (*info->fprintf_func)(pFVar15,"%s",pcVar12);
    break;
  case 0x2a:
    iVar6 = 9;
    goto LAB_0012e1e4;
  case 0x2b:
  case 0x4b:
    if (bVar2 == 0x33) {
      uVar9 = fetch_arg(buffer,0x33,8,info);
      if ((int)uVar9 < 0) {
        return -3;
      }
      if (uVar9 == 0) {
        (*info->fprintf_func)(info->stream,"#0");
      }
      else {
        uVar5 = uVar9;
        if (*d == 'l') {
          uVar5 = 0;
          for (iVar18 = 0; iVar18 != 8; iVar18 = iVar18 + 1) {
            uVar16 = 1 << ((byte)iVar18 & 0x1f);
            if (-1 < (char)(uVar9 << ((byte)iVar18 & 0x1f))) {
              uVar16 = 0;
            }
            uVar5 = uVar5 | uVar16;
          }
        }
        bVar21 = true;
        uVar9 = 0;
        while ((int)uVar9 < 8) {
          if (((uVar5 & 0xff) >> (uVar9 & 0x1f) & 1) == 0) {
            uVar9 = uVar9 + 1;
          }
          else {
            if (!bVar21) {
              (*info->fprintf_func)(info->stream,"/");
            }
            (*info->fprintf_func)(info->stream,"fp%d",(ulong)uVar9);
            uVar16 = uVar9;
            do {
              uVar19 = uVar16;
              uVar16 = uVar19 + 1;
            } while (((uVar5 & 0xff) >> (uVar16 & 0x1f) & 1) != 0);
            bVar21 = false;
            bVar4 = (int)uVar9 < (int)uVar19;
            uVar9 = uVar16;
            if (bVar4) {
              bVar21 = false;
              (*info->fprintf_func)(info->stream,"-fp%d");
            }
          }
        }
      }
      break;
    }
    if (bVar2 != 0x38) {
      if (bVar2 != 0x77) {
        return -2;
      }
      pbVar20 = buffer + 4;
      if ((*info->private_data < pbVar20) && (iVar18 = fetch_data(info,pbVar20), iVar18 == 0)) {
        return -3;
      }
      uVar9 = (uint)buffer[3] << 0x10 | (uint)buffer[2] << 0x18;
      if (pbVar20 <= p0) {
        pbVar20 = p0;
      }
      if (uVar9 != 0) {
        uVar9 = (int)uVar9 >> 0x10;
        uVar5 = uVar9;
        if (*d == 'l') {
          uVar5 = 0;
          for (iVar18 = 0; iVar18 != 0x10; iVar18 = iVar18 + 1) {
            uVar16 = 1 << ((byte)iVar18 & 0x1f);
            if (-1 < (short)(uVar9 << ((byte)iVar18 & 0x1f))) {
              uVar16 = 0;
            }
            uVar5 = uVar5 | uVar16;
          }
        }
        bVar21 = true;
        uVar9 = 0;
        do {
          ppcVar7 = reg_names + (int)uVar9;
          lVar17 = (long)(int)uVar9 + -1;
          uVar16 = uVar9;
          while( true ) {
            if (0xf < (int)uVar16) goto LAB_0012eb76;
            if (((uVar5 & 0xffff) >> (uVar16 & 0x1f) & 1) != 0) break;
            uVar16 = uVar16 + 1;
            ppcVar7 = ppcVar7 + 1;
            lVar17 = lVar17 + 1;
          }
          if (!bVar21) {
            (*info->fprintf_func)(info->stream,"/");
          }
          (*info->fprintf_func)(info->stream,"%s",*ppcVar7);
          uVar9 = uVar16;
          do {
            uVar9 = uVar9 + 1;
            lVar17 = lVar17 + 1;
          } while (((uVar5 & 0xffff) >> (uVar9 & 0x1f) & 1) != 0);
          bVar21 = false;
          if ((int)uVar16 < (int)lVar17) {
            (*info->fprintf_func)(info->stream,"-%s",reg_names[lVar17]);
            bVar21 = false;
          }
        } while( true );
      }
      (*info->fprintf_func)(info->stream,"#0");
      break;
    }
    iVar18 = 0x38;
    goto LAB_0012ea66;
  case 0x2c:
    if (bVar2 == 0x68) {
      (*info->fprintf_func)
                (info->stream,"%s",
                 (long)&print_insn_arg_scalefactor_name_rel +
                 (long)*(int *)((long)&print_insn_arg_scalefactor_name_rel + (ulong)(buffer[2] & 4))
                );
      break;
    }
    uVar9 = fetch_arg(buffer,iVar18,8,info);
    if ((int)uVar9 < 0) {
      return -3;
    }
    uVar10 = (ulong)(uVar9 - 0x100);
    if (-1 < (char)uVar9) {
      uVar10 = (ulong)uVar9;
    }
    goto LAB_0012ea4a;
  case 0x2e:
    uVar9 = fetch_arg(buffer,iVar18,6,info);
    if ((int)uVar9 < 0) {
      return -3;
    }
    pFVar15 = info->stream;
    p_Var8 = info->fprintf_func;
    if ((uVar9 & 0x20) != 0) {
      (*p_Var8)(pFVar15,"%s",reg_names[uVar9 & 7]);
      break;
    }
    pcVar12 = "%d";
LAB_0012eee9:
    (*p_Var8)(pFVar15,pcVar12,(ulong)uVar9);
    break;
  case 0x30:
    uVar9 = fetch_arg(buffer,iVar18,3,info);
    if ((int)uVar9 < 0) {
      return -3;
    }
    if (uVar9 == 0) {
      uVar9 = (uint)(d[1] != 's') << 3;
    }
    (*info->fprintf_func)(info->stream,"#%d",(ulong)uVar9);
    break;
  case 0x31:
    iVar6 = 4;
LAB_0012e619:
    uVar9 = fetch_arg(buffer,iVar18,iVar6,info);
    if ((int)uVar9 < 0) {
      return -3;
    }
    pFVar15 = info->stream;
    ppcVar7 = reg_names;
LAB_0012ea86:
    pcVar12 = ppcVar7[uVar9];
    goto LAB_0012eb63;
  case 0x32:
    pFVar15 = info->stream;
    pcVar12 = "sr";
    goto LAB_0012e606;
  case 0x33:
    iVar6 = 4;
LAB_0012e1e4:
    uVar9 = fetch_arg(buffer,iVar18,iVar6,info);
    if ((int)uVar9 < 0) {
      return -3;
    }
    pFVar15 = info->stream;
LAB_0012e49b:
    pcVar12 = "#%d";
    goto LAB_0012e680;
  case 0x34:
    pFVar15 = info->stream;
    pcVar12 = "usp";
    goto LAB_0012e606;
  case 0x35:
    pFVar15 = info->stream;
    pcVar12 = "val";
LAB_0012e606:
    (*info->fprintf_func)(pFVar15,pcVar12);
    break;
  case 0x37:
    iVar18 = 0x38;
LAB_0012df47:
    uVar9 = fetch_arg(buffer,iVar18,5,info);
    if ((int)uVar9 < 0) {
      return -3;
    }
    switch(uVar9) {
    case 2:
      pcVar12 = "tt0";
      break;
    case 3:
      pcVar12 = "tt1";
      break;
    default:
      pFVar15 = info->stream;
      pcVar12 = "<mmu register %d>";
      uVar10 = (ulong)uVar9;
      goto LAB_0012e682;
    case 0x10:
      pcVar12 = "tc";
      break;
    case 0x11:
      pcVar12 = "drp";
      break;
    case 0x12:
      pcVar12 = "srp";
      break;
    case 0x13:
      pcVar12 = "crp";
      break;
    case 0x14:
      pcVar12 = "cal";
      break;
    case 0x15:
      pcVar12 = "val";
      break;
    case 0x16:
      pcVar12 = "scc";
      break;
    case 0x17:
      pcVar12 = "ac";
      break;
    case 0x18:
      pcVar12 = "psr";
      break;
    case 0x19:
      pcVar12 = "pcsr";
      break;
    case 0x1c:
    case 0x1d:
      uVar10 = (ulong)(buffer[3] >> 2 & 7);
      pFVar15 = info->stream;
      pcVar12 = "bac%d";
      if (uVar9 == 0x1c) {
        pcVar12 = "bad%d";
      }
      goto LAB_0012e682;
    }
    pFVar15 = info->stream;
    goto LAB_0012eb63;
  case 0x3e:
    pbVar20 = p0 + 4;
    if ((*info->private_data < pbVar20) && (iVar18 = fetch_data(info,pbVar20), iVar18 == 0)) {
      return -3;
    }
    uVar9 = *(uint *)p0;
    bVar14 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
LAB_0012f01b:
    info->target = bVar14;
    (*info->print_address_func)(bVar14,info);
    break;
  case 0x40:
    uVar9 = fetch_arg(buffer,iVar18,3,info);
    if ((int)uVar9 < 0) {
      return -3;
    }
    pFVar15 = info->stream;
    pcVar12 = reg_names[(ulong)uVar9 + 8];
    goto LAB_0012e5b9;
  case 0x42:
    uVar9 = fetch_arg(buffer,iVar18,2,info);
    if ((int)uVar9 < 0) {
      return -3;
    }
    pFVar15 = info->stream;
    pcVar12 = print_insn_arg_cacheFieldName_rel +
              *(int *)(print_insn_arg_cacheFieldName_rel + (ulong)uVar9 * 4);
LAB_0012eb63:
    pcVar13 = "%s";
    goto LAB_0012eb6a;
  case 0x43:
    pbVar20 = p0 + 2;
    if ((*info->private_data < pbVar20) && (iVar6 = fetch_data(info,pbVar20), iVar6 == 0)) {
      return -3;
    }
    bVar1 = *p0;
    bVar2 = p0[1];
    uVar9 = fetch_arg(buffer,iVar18,3,info);
    if ((int)uVar9 < 0) {
      return -3;
    }
    (*info->fprintf_func)
              (info->stream,"%d(%s)",
               (ulong)(uint)((int)((uint)bVar2 << 0x10 | (uint)bVar1 << 0x18) >> 0x10),
               reg_names[(ulong)uVar9 + 8]);
    break;
  case 0x44:
    uVar9 = fetch_arg(buffer,iVar18,2,info);
    if ((int)uVar9 < 0) {
      return -3;
    }
    pFVar15 = info->stream;
    pcVar12 = "%%acc%d";
    goto LAB_0012e680;
  case 0x45:
    uVar9 = fetch_arg(buffer,iVar18,5,info);
    if ((int)uVar9 < 0) {
      return -3;
    }
    pFVar15 = info->stream;
    p_Var8 = info->fprintf_func;
    if (uVar9 == 0) {
      pcVar12 = "sfc";
    }
    else {
      if (uVar9 != 1) {
        pcVar12 = "<function code %d>";
        goto LAB_0012eee9;
      }
      pcVar12 = "dfc";
    }
    (*p_Var8)(pFVar15,pcVar12);
    break;
  case 0x46:
    iVar18 = fetch_arg(buffer,iVar18,1,info);
    if (iVar18 < 0) {
      return -3;
    }
    pFVar15 = info->stream;
    pcVar12 = "23";
    if (iVar18 == 0) {
      pcVar12 = "01";
    }
    pcVar13 = "%%accext%s";
    goto LAB_0012eb6a;
  case 0x48:
    iVar18 = fetch_arg(buffer,iVar18,2,info);
    if (iVar18 < 0) {
      return -3;
    }
    if (iVar18 == 3) {
      pFVar15 = info->stream;
      pcVar12 = ">>";
    }
    else {
      if (iVar18 != 1) {
        return -1;
      }
      pFVar15 = info->stream;
      pcVar12 = "<<";
    }
    (*info->fprintf_func)(pFVar15,pcVar12);
    break;
  case 0x49:
    iVar18 = fetch_arg(buffer,iVar18,3,info);
    if (iVar18 < 0) {
      return -3;
    }
    pFVar15 = info->stream;
    uVar9 = iVar18 + 1;
    goto LAB_0012e49b;
  case 0x4a:
    if (bVar2 != 0x43) {
      if (bVar2 != 0x6b) {
        return -1;
      }
      uVar9 = fetch_arg(buffer,0x6b,3,info);
      if ((int)uVar9 < 0) {
        return -3;
      }
      pFVar15 = info->stream;
      pcVar12 = reg_names[uVar9];
      pcVar13 = "{%s}";
      goto LAB_0012eb6a;
    }
    uVar9 = fetch_arg(buffer,0x43,7,info);
    if ((int)uVar9 < 0) {
      return -3;
    }
    uVar5 = uVar9 - 0x80;
    if (uVar9 < 0x40) {
      uVar5 = uVar9;
    }
    uVar10 = (ulong)uVar5;
    pFVar15 = info->stream;
    pcVar12 = "{#%d}";
    goto LAB_0012e682;
  case 0x51:
    uVar9 = fetch_arg(buffer,iVar18,4,info);
    if ((int)uVar9 < 0) {
      return -3;
    }
    pFVar15 = info->stream;
    pcVar12 = reg_names[uVar9];
LAB_0012e5b9:
    pcVar13 = "(%s)";
LAB_0012eb6a:
    (*info->fprintf_func)(pFVar15,pcVar13,pcVar12);
    break;
  case 0x52:
LAB_0012ea66:
    uVar9 = fetch_arg(buffer,iVar18,3,info);
    if ((int)uVar9 < 0) {
      return -3;
    }
    pFVar15 = info->stream;
    ppcVar7 = fpcr_names;
    goto LAB_0012ea86;
  case 0x53:
    uVar9 = fetch_arg(buffer,iVar18,3,info);
    if ((int)uVar9 < 0) {
      return -3;
    }
    pFVar15 = info->stream;
    pcVar12 = "%d";
LAB_0012e680:
    uVar10 = (ulong)uVar9;
LAB_0012e682:
    (*info->fprintf_func)(pFVar15,pcVar12,uVar10);
    break;
  case 0x54:
    uVar9 = fetch_arg(buffer,iVar18,5,info);
    if ((int)uVar9 < 0) {
      return -3;
    }
    pcVar12 = "u";
    uVar5 = uVar9 & 0xf;
    if ((uVar9 & 0x10) == 0) {
      pcVar12 = "l";
      uVar5 = uVar9;
    }
    (*info->fprintf_func)
              (info->stream,"%s%s",
               reg_half_names_rel + *(int *)(reg_half_names_rel + (ulong)uVar5 * 4),pcVar12);
    break;
  case 0x57:
    uVar9 = fetch_arg(buffer,iVar18,3,info);
    if ((int)uVar9 < 0) {
      return -3;
    }
    uVar10 = (ulong)(-(uint)(uVar9 == 0) | uVar9);
LAB_0012ea4a:
    pFVar15 = info->stream;
    pcVar12 = "#%d";
    goto LAB_0012e682;
  }
LAB_0012eb76:
  return (int)pbVar20 - (int)p0;
}

Assistant:

static int
print_insn_arg (const char *d,
		unsigned char *buffer,
		unsigned char *p0,
		bfd_vma addr,
		disassemble_info *info)
{
  int val = 0;
  int place = d[1];
  unsigned char *p = p0;
  int regno;
  const char *regname;
  unsigned char *p1;
  double flval;
  int flt_p;
  bfd_signed_vma disp;
  unsigned int uval;

  switch (*d)
    {
    case 'c':		/* Cache identifier.  */
      {
        static char *const cacheFieldName[] = { "nc", "dc", "ic", "bc" };
        FETCH_ARG (2, val);
	(*info->fprintf_func) (info->stream, "%s", cacheFieldName[val]);
        break;
      }

    case 'a':		/* Address register indirect only. Cf. case '+'.  */
      {
	FETCH_ARG (3, val);
#ifdef MOTOROLA
	(*info->fprintf_func) (info->stream, "(%s)", reg_names[val + 8]);
#else
	(*info->fprintf_func) (info->stream, "%s@", reg_names[val + 8]);
#endif
        break;
      }

    case '_':		/* 32-bit absolute address for move16.  */
      {
        NEXTULONG (p, uval);
        info->target = uval;
	(*info->print_address_func) (uval, info);
        break;
      }

    case 'C':
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "ccr");
#else
      (*info->fprintf_func) (info->stream, "%%ccr");
#endif
      break;

    case 'S':
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "sr");
#else
      (*info->fprintf_func) (info->stream, "%%sr");
#endif
      break;

    case 'U':
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "usp");
#else
      (*info->fprintf_func) (info->stream, "%%usp");
#endif
      break;

    case 'E':
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "acc");
#else
      (*info->fprintf_func) (info->stream, "%%acc");
#endif
      break;

    case 'G':
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "macsr");
#else
      (*info->fprintf_func) (info->stream, "%%macsr");
#endif
      break;

    case 'H':
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "mask");
#else
      (*info->fprintf_func) (info->stream, "%%mask");
#endif
      break;

    case 'J':
      {
	/* FIXME: There's a problem here, different m68k processors call the
	   same address different names.  The tables below try to get it right
	   using info->mach, but only for v4e.  */
	struct regname { char * name; int value; };
#ifdef MOTOROLA
	static const struct regname names[] =
	  {
          {"sfc", 0x000},
          {"dfc", 0x001},
          {"cacr", 0x002},
          {"tc",  0x003},
          {"itt0",0x004},
          {"itt1", 0x005},
          {"dtt0",0x006},
          {"dtt1",0x007},
          // {"buscr",0x008},
          // {"rgpiobar", 0x009},
          // {"acr4",0x00c},
          // {"acr5",0x00d},
          // {"acr6",0x00e},
          // {"acr7", 0x00f},
          {"usp", 0x800},
          {"vbr", 0x801},
          {"caar", 0x802},
          {"msp", 0x803},
          {"isp", 0x804},
          // {"pc", 0x80f},
	    /* Reg c04 is sometimes called flashbar or rambar.
	       Reg c05 is also sometimes called rambar.  */
          // {"rambar0", 0xc04},
          // {"rambar1", 0xc05},

	    /* reg c0e is sometimes called mbar2 or secmbar.
	       reg c0f is sometimes called mbar.  */
          // {"mbar0", 0xc0e},
          // {"mbar1", 0xc0f},

	    /* Should we be calling this psr like we do in case 'Y'?  */
          {"mmusr",0x805},

          {"urp", 0x806},
          {"srp", 0x807},
          // {"pcr", 0x808},

	    /* Fido added these.  */
	    // {"cac", 0xffe},
        // {"mbo", 0xfff}
	};
	/* Alternate names for v4e (MCF5407/5445x/MCF547x/MCF548x), at least.  */
	static const struct regname names_v4e[] =
	  {
	    {"asid",0x003}, {"acr0",0x004}, {"acr1",0x005},
	    {"acr2",0x006}, {"acr3",0x007}, {"mmubar",0x008},
	  };
#else
	static const struct regname names[] =
	  {
	    {"%sfc", 0x000},
        {"%dfc", 0x001},
        {"%cacr", 0x002},
	    {"%tc",  0x003},
        {"%itt0",0x004},
        {"%itt1", 0x005},
	    {"%dtt0",0x006},
        {"%dtt1",0x007},
        // {"%buscr",0x008},
	    // {"%rgpiobar", 0x009},
        // {"%acr4",0x00c},
	    // {"%acr5",0x00d},
        // {"%acr6",0x00e},
        // {"%acr7", 0x00f},
	    {"%usp", 0x800},
        {"%vbr", 0x801},
        {"%caar", 0x802},
	    {"%msp", 0x803},
        {"%isp", 0x804},
	    // {"%pc", 0x80f},
	    /* Reg c04 is sometimes called flashbar or rambar.
	       Reg c05 is also sometimes called rambar.  */
	    // {"%rambar0", 0xc04},
        // {"%rambar1", 0xc05},

	    /* reg c0e is sometimes called mbar2 or secmbar.
	       reg c0f is sometimes called mbar.  */
	    // {"%mbar0", 0xc0e},
        // {"%mbar1", 0xc0f},

	    /* Should we be calling this psr like we do in case 'Y'?  */
	    {"%mmusr",0x805},

	    {"%urp", 0x806},
        {"%srp", 0x807},
        // {"%pcr", 0x808},

	    /* Fido added these.  */
	    // {"%cac", 0xffe},
        // {"%mbo", 0xfff}
	};
	/* Alternate names for v4e (MCF5407/5445x/MCF547x/MCF548x), at least.  */
	static const struct regname names_v4e[] =
	  {
	    {"%asid",0x003}, {"%acr0",0x004}, {"%acr1",0x005},
	    {"%acr2",0x006}, {"%acr3",0x007}, {"%mmubar",0x008},
	  };
#endif
	unsigned int arch_mask;

	arch_mask = bfd_m68k_mach_to_features (info->mach);
	FETCH_ARG (12, val);
	if (arch_mask & (mcfisa_b | mcfisa_c))
	  {
	    for (regno = ARRAY_SIZE (names_v4e); --regno >= 0;)
	      if (names_v4e[regno].value == val)
		{
		  (*info->fprintf_func) (info->stream, "%s", names_v4e[regno].name);
		  break;
		}
	    if (regno >= 0)
	      break;
	  }
	for (regno = ARRAY_SIZE (names) - 1; regno >= 0; regno--)
	  if (names[regno].value == val)
	    {
	      (*info->fprintf_func) (info->stream, "%s", names[regno].name);
	      break;
	    }
	if (regno < 0)
	  // (*info->fprintf_func) (info->stream, "0x%x", val); // DIRK: Replaced by...
        (*info->fprintf_func) (info->stream, "%d", val); // DIRK
      }
      break;

    case 'Q':
      FETCH_ARG (3, val);
      /* 0 means 8, except for the bkpt instruction... */
      if (val == 0 && d[1] != 's')
	val = 8;
      (*info->fprintf_func) (info->stream, "#%d", val);
      break;

    case 'x':
      FETCH_ARG (3, val);
      /* 0 means -1.  */
      if (val == 0)
	val = -1;
      (*info->fprintf_func) (info->stream, "#%d", val);
      break;

    case 'j':
      FETCH_ARG (3, val);
      (*info->fprintf_func) (info->stream, "#%d", val+1);
      break;

    case 'K':
      FETCH_ARG (9, val);
      (*info->fprintf_func) (info->stream, "#%d", val);
      break;

    case 'M':
      if (place == 'h')
	{
	  static char *const scalefactor_name[] = { "<<", ">>" };

	  FETCH_ARG (1, val);
	  (*info->fprintf_func) (info->stream, "%s", scalefactor_name[val]);
	}
      else
	{
	  FETCH_ARG (8, val);
	  if (val & 0x80)
	    val = val - 0x100;
	  (*info->fprintf_func) (info->stream, "#%d", val);
	}
      break;

    case 'T':
      FETCH_ARG (4, val);
      (*info->fprintf_func) (info->stream, "#%d", val);
      break;

    case 'D':
      FETCH_ARG (3, val);
      (*info->fprintf_func) (info->stream, "%s", reg_names[val]);
      break;

    case 'A':
      FETCH_ARG (3, val);
      (*info->fprintf_func) (info->stream, "%s", reg_names[val + 010]);
      break;

    case 'R':
      FETCH_ARG (4, val);
      (*info->fprintf_func) (info->stream, "%s", reg_names[val]);
      break;

    case 'r':
      FETCH_ARG (4, regno);
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "(%s)", reg_names[regno]);
#else
      if (regno > 7)
	(*info->fprintf_func) (info->stream, "%s@", reg_names[regno]);
      else
	(*info->fprintf_func) (info->stream, "@(%s)", reg_names[regno]);
#endif
      break;

    case 'F':
      FETCH_ARG (3, val);
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "fp%d", val);
#else
      (*info->fprintf_func) (info->stream, "%%fp%d", val);
#endif
      break;

    case 'O':
      FETCH_ARG (6, val);
      if (val & 0x20)
	(*info->fprintf_func) (info->stream, "%s", reg_names[val & 7]);
      else
	(*info->fprintf_func) (info->stream, "%d", val);
      break;

    case '+':
      FETCH_ARG (3, val);
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "(%s)+", reg_names[val + 8]);
#else
      (*info->fprintf_func) (info->stream, "%s@+", reg_names[val + 8]);
#endif
      break;

    case '-':
      FETCH_ARG (3, val);
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "-(%s)", reg_names[val + 8]);
#else
      (*info->fprintf_func) (info->stream, "%s@-", reg_names[val + 8]);
#endif
      break;

    case 'k':
      if (place == 'k')
	{
	  FETCH_ARG (3, val);
	  (*info->fprintf_func) (info->stream, "{%s}", reg_names[val]);
	}
      else if (place == 'C')
	{
	  FETCH_ARG (7, val);
	  if (val > 63)		/* This is a signed constant.  */
	    val -= 128;
	  (*info->fprintf_func) (info->stream, "{#%d}", val);
	}
      else
	return PRINT_INSN_ARG_INVALID_OPERAND;
      break;

    case '#':
    case '^':
      p1 = buffer + (*d == '#' ? 2 : 4);
      if (place == 's')
	FETCH_ARG (4, val);
      else if (place == 'C')
	FETCH_ARG (7, val);
      else if (place == '8')
	FETCH_ARG (3, val);
      else if (place == '3')
	FETCH_ARG (8, val);
      else if (place == 'b')
	NEXTBYTE (p1, val);
      else if (place == 'w' || place == 'W')
	NEXTWORD (p1, val, PRINT_INSN_ARG_MEMORY_ERROR);
      else if (place == 'l')
	NEXTLONG (p1, val, PRINT_INSN_ARG_MEMORY_ERROR);
      else
	return PRINT_INSN_ARG_INVALID_OP_TABLE;

      (*info->fprintf_func) (info->stream, "#%d", val);
      break;

    case 'B':
      if (place == 'b')
	NEXTBYTE (p, disp);
      else if (place == 'B')
	disp = COERCE_SIGNED_CHAR (buffer[1]);
      else if (place == 'w' || place == 'W')
	NEXTWORD (p, disp, PRINT_INSN_ARG_MEMORY_ERROR);
      else if (place == 'l' || place == 'L' || place == 'C')
	NEXTLONG (p, disp, PRINT_INSN_ARG_MEMORY_ERROR);
      else if (place == 'g')
	{
	  NEXTBYTE (buffer, disp);
	  if (disp == 0)
	    NEXTWORD (p, disp, PRINT_INSN_ARG_MEMORY_ERROR);
	  else if (disp == -1)
	    NEXTLONG (p, disp, PRINT_INSN_ARG_MEMORY_ERROR);
	}
      else if (place == 'c')
	{
	  if (buffer[1] & 0x40)		/* If bit six is one, long offset.  */
	    NEXTLONG (p, disp, PRINT_INSN_ARG_MEMORY_ERROR);
	  else
	    NEXTWORD (p, disp, PRINT_INSN_ARG_MEMORY_ERROR);
	}
      else
	return PRINT_INSN_ARG_INVALID_OP_TABLE;

      info->target = addr + disp;
      (*info->print_address_func) (addr + disp, info);
      break;

    case 'd':
      {
	int val1;

	NEXTWORD (p, val, PRINT_INSN_ARG_MEMORY_ERROR);
	FETCH_ARG (3, val1);
#ifdef MOTOROLA
	(*info->fprintf_func) (info->stream, "%d(%s)", val, reg_names[val1 + 8]);
#else
	(*info->fprintf_func) (info->stream, "%s@(%d)", reg_names[val1 + 8], val);
#endif
	break;
      }

    case 's':
      FETCH_ARG (3, val);
      (*info->fprintf_func) (info->stream, "%s", fpcr_names[val]);
      break;

    case 'e':
      FETCH_ARG (2, val);
      (*info->fprintf_func) (info->stream, "%%acc%d", val);
      break;

    case 'g':
      FETCH_ARG (1, val);
      (*info->fprintf_func) (info->stream, "%%accext%s", val == 0 ? "01" : "23");
      break;

    case 'i':
      FETCH_ARG (2, val);
      if (val == 1)
	(*info->fprintf_func) (info->stream, "<<");
      else if (val == 3)
	(*info->fprintf_func) (info->stream, ">>");
      else
	return PRINT_INSN_ARG_INVALID_OPERAND;
      break;

    case 'I':
      /* Get coprocessor ID... */
      val = fetch_arg (buffer, 'd', 3, info);
      if (val < 0)
	return PRINT_INSN_ARG_MEMORY_ERROR;
      if (val != 1)				/* Unusual coprocessor ID?  */
	(*info->fprintf_func) (info->stream, "(cpid=%d) ", val);
      break;

    case '4':
    case '*':
    case '~':
    case '%':
    case ';':
    case '@':
    case '!':
    case '$':
    case '?':
    case '/':
    case '&':
    case '|':
    case '<':
    case '>':
    case 'm':
    case 'n':
    case 'o':
    case 'p':
    case 'q':
    case 'v':
    case 'b':
    case 'w':
    case 'y':
    case 'z':
      if (place == 'd')
	{
	  val = fetch_arg (buffer, 'x', 6, info);
	  if (val < 0)
	    return PRINT_INSN_ARG_MEMORY_ERROR;
	  val = ((val & 7) << 3) + ((val >> 3) & 7);
	}
      else
	{
	  val = fetch_arg (buffer, 's', 6, info);
	  if (val < 0)
	    return PRINT_INSN_ARG_MEMORY_ERROR;
	}

      /* If the <ea> is invalid for *d, then reject this match.  */
      if (!m68k_valid_ea (*d, val))
	return PRINT_INSN_ARG_INVALID_OPERAND;

      /* Get register number assuming address register.  */
      regno = (val & 7) + 8;
      regname = reg_names[regno];
      switch (val >> 3)
	{
	case 0:
	  (*info->fprintf_func) (info->stream, "%s", reg_names[val]);
	  break;

	case 1:
	  (*info->fprintf_func) (info->stream, "%s", regname);
	  break;

	case 2:
#ifdef MOTOROLA
	  (*info->fprintf_func) (info->stream, "(%s)", regname);
#else
	  (*info->fprintf_func) (info->stream, "%s@", regname);
#endif
	  break;

	case 3:
#ifdef MOTOROLA
	  (*info->fprintf_func) (info->stream, "(%s)+", regname);
#else
	  (*info->fprintf_func) (info->stream, "%s@+", regname);
#endif
	  break;

	case 4:
#ifdef MOTOROLA
	  (*info->fprintf_func) (info->stream, "-(%s)", regname);
#else
	  (*info->fprintf_func) (info->stream, "%s@-", regname);
#endif
	  break;

	case 5:
	  NEXTWORD (p, val, PRINT_INSN_ARG_MEMORY_ERROR);
#ifdef MOTOROLA
	  if (dump_baserel)
	    {
	      (*info->fprintf_func) (info->stream, "(");
	      print_base(regno, val, info);
	      (*info->fprintf_func) (info->stream, ")");
	    }
	  else
	    (*info->fprintf_func) (info->stream, "%d(%s)", val, regname);
#else
	  (*info->fprintf_func) (info->stream, "%s@(%d)", regname, val);
#endif
	  break;

	case 6:
	  p = print_indexed (regno, p, addr, info);
	  if (p == NULL)
	    return PRINT_INSN_ARG_MEMORY_ERROR;
	  break;

	case 7:
	  switch (val & 7)
	    {
	    case 0:
          NEXTWORD (p, val, PRINT_INSN_ARG_MEMORY_ERROR);
        info->target = val;
	      (*info->print_address_func) ((unsigned short)val, info); // DIRK: Added (unsigned short)
	      break;

	    case 1:
	      NEXTULONG (p, uval);
        info->target = uval;
	      (*info->print_address_func) (uval, info);
	      break;

	    case 2:
	      NEXTWORD (p, val, PRINT_INSN_ARG_MEMORY_ERROR);
        info->target = addr + val;
#ifdef MOTOROLA
	      (*info->print_address_func) (addr + val, info);
	      (*info->fprintf_func) (info->stream, "(pc)");
#else
	      (*info->fprintf_func) (info->stream, "%%pc@(");
	      (*info->print_address_func) (addr + val, info);
	      (*info->fprintf_func) (info->stream, ")");
#endif
	      break;

	    case 3:
	      p = print_indexed (-1, p, addr, info);
	      if (p == NULL)
		return PRINT_INSN_ARG_MEMORY_ERROR;
	      break;

	    case 4:
	      flt_p = 1;	/* Assume it's a float... */
	      switch (place)
	      {
		case 'b':
		  NEXTBYTE (p, val);
		  flt_p = 0;
		  break;

		case 'w':
		  NEXTWORD (p, val, PRINT_INSN_ARG_MEMORY_ERROR);
		  flt_p = 0;
		  break;

		case 'l':
		  NEXTLONG (p, val, PRINT_INSN_ARG_MEMORY_ERROR);
		  flt_p = 0;
		  break;

		case 'f':
		  NEXTSINGLE (flval, p);
		  break;

		case 'F':
		  NEXTDOUBLE (flval, p);
		  break;

		case 'x':
		  NEXTEXTEND (flval, p);
		  break;

		case 'p':
		  NEXTPACKED (p, flval);
		  break;

		default:
		  return PRINT_INSN_ARG_INVALID_OPERAND;
	      }
	      if (flt_p)	/* Print a float? */
              (*info->fprintf_func) (info->stream, "#<fixme>"); //  "#0e%g", flval);  // DIRK: REMOVE ASAP
	      else
		(*info->fprintf_func) (info->stream, "#%d", val);
	      break;

	    default:
	      return PRINT_INSN_ARG_INVALID_OPERAND;
	    }
	}

      /* If place is '/', then this is the case of the mask bit for
	 mac/emac loads. Now that the arg has been printed, grab the
	 mask bit and if set, add a '&' to the arg.  */
      if (place == '/')
	{
	  FETCH_ARG (1, val);
	  if (val)
	    info->fprintf_func (info->stream, "&");
	}
      break;

    case 'L':
    case 'l':
	if (place == 'w')
	  {
	    char doneany;
	    p1 = buffer + 2;
	    NEXTWORD (p1, val, PRINT_INSN_ARG_MEMORY_ERROR);
	    /* Move the pointer ahead if this point is farther ahead
	       than the last.  */
	    p = p1 > p ? p1 : p;
	    if (val == 0)
	      {
		(*info->fprintf_func) (info->stream, "#0");
		break;
	      }
	    if (*d == 'l')
	      {
		int newval = 0;

		for (regno = 0; regno < 16; ++regno)
		  if (val & (0x8000 >> regno))
		    newval |= 1 << regno;
		val = newval;
	      }
	    val &= 0xffff;
	    doneany = 0;
	    for (regno = 0; regno < 16; ++regno)
	      if (val & (1 << regno))
		{
		  int first_regno;

		  if (doneany)
		    (*info->fprintf_func) (info->stream, "/");
		  doneany = 1;
		  (*info->fprintf_func) (info->stream, "%s", reg_names[regno]);
		  first_regno = regno;
		  while (val & (1 << (regno + 1)))
		    ++regno;
		  if (regno > first_regno)
		    (*info->fprintf_func) (info->stream, "-%s",
					   reg_names[regno]);
		}
	  }
	else if (place == '3')
	  {
	    /* `fmovem' insn.  */
	    char doneany;

	    FETCH_ARG (8, val);
	    if (val == 0)
	      {
		(*info->fprintf_func) (info->stream, "#0");
		break;
	      }
	    if (*d == 'l')
	      {
		int newval = 0;

		for (regno = 0; regno < 8; ++regno)
		  if (val & (0x80 >> regno))
		    newval |= 1 << regno;
		val = newval;
	      }
	    val &= 0xff;
	    doneany = 0;
	    for (regno = 0; regno < 8; ++regno)
	      if (val & (1 << regno))
		{
		  int first_regno;
		  if (doneany)
		    (*info->fprintf_func) (info->stream, "/");
		  doneany = 1;
#ifdef MOTOROLA
		  (*info->fprintf_func) (info->stream, "fp%d", regno);
#else
		  (*info->fprintf_func) (info->stream, "%%fp%d", regno);
#endif
		  first_regno = regno;
		  while (val & (1 << (regno + 1)))
		    ++regno;
		  if (regno > first_regno)
#ifdef MOTOROLA
		    (*info->fprintf_func) (info->stream, "-fp%d", regno);
#else
		    (*info->fprintf_func) (info->stream, "-%%fp%d", regno);
#endif
		}
	  }
	else if (place == '8')
	  {
	    FETCH_ARG (3, val);
	    /* fmoveml for FP status registers.  */
	    (*info->fprintf_func) (info->stream, "%s", fpcr_names[val]);
	  }
	else
	  return PRINT_INSN_ARG_INVALID_OP_TABLE;
      break;

    case 'X':
      place = '8';
      /* Fall through.  */
    case 'Y':
    case 'Z':
    case 'W':
    case '0':
    case '1':
    case '2':
    case '3':
      {
	char *name = 0;

	FETCH_ARG (5, val);
	switch (val)
	  {
#ifdef MOTOROLA
	  case 2: name = "tt0"; break;
	  case 3: name = "tt1"; break;
	  case 0x10: name = "tc"; break;
	  case 0x11: name = "drp"; break;
	  case 0x12: name = "srp"; break;
	  case 0x13: name = "crp"; break;
	  case 0x14: name = "cal"; break;
	  case 0x15: name = "val"; break;
	  case 0x16: name = "scc"; break;
	  case 0x17: name = "ac"; break;
 	  case 0x18: name = "psr"; break;
	  case 0x19: name = "pcsr"; break;
	  case 0x1c:
	  case 0x1d:
	    {
	      int break_reg = ((buffer[3] >> 2) & 7);

	      (*info->fprintf_func)
		(info->stream, val == 0x1c ? "bad%d" : "bac%d",
		 break_reg);
	    }
#else
	  case 2: name = "%tt0"; break;
	  case 3: name = "%tt1"; break;
	  case 0x10: name = "%tc"; break;
	  case 0x11: name = "%drp"; break;
	  case 0x12: name = "%srp"; break;
	  case 0x13: name = "%crp"; break;
	  case 0x14: name = "%cal"; break;
	  case 0x15: name = "%val"; break;
	  case 0x16: name = "%scc"; break;
	  case 0x17: name = "%ac"; break;
 	  case 0x18: name = "%psr"; break;
	  case 0x19: name = "%pcsr"; break;
	  case 0x1c:
	  case 0x1d:
	    {
	      int break_reg = ((buffer[3] >> 2) & 7);

	      (*info->fprintf_func)
		(info->stream, val == 0x1c ? "%%bad%d" : "%%bac%d",
		 break_reg);
	    }
#endif
	    break;
	  default:
	    (*info->fprintf_func) (info->stream, "<mmu register %d>", val);
	  }
	if (name)
	  (*info->fprintf_func) (info->stream, "%s", name);
      }
      break;

    case 'f':
      {
	int fc;

	FETCH_ARG (5, fc);
	if (fc == 1)
#ifdef MOTOROLA
	  (*info->fprintf_func) (info->stream, "dfc");
	else if (fc == 0)
	  (*info->fprintf_func) (info->stream, "sfc");
#else
	  (*info->fprintf_func) (info->stream, "%%dfc");
	else if (fc == 0)
	  (*info->fprintf_func) (info->stream, "%%sfc");
#endif
	else
	  /* xgettext:c-format */
	  (*info->fprintf_func) (info->stream, _("<function code %d>"), fc);
      }
      break;

    case 'V':
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "val");
#else
      (*info->fprintf_func) (info->stream, "%%val");
#endif
      break;

    case 't':
      {
	int level;

	FETCH_ARG (3, level);
	(*info->fprintf_func) (info->stream, "%d", level);
      }
      break;

    case 'u':
      {
	short is_upper = 0;
	int reg;

	FETCH_ARG (5, reg);
	if (reg & 0x10)
	  {
	    is_upper = 1;
	    reg &= 0xf;
	  }
	(*info->fprintf_func) (info->stream, "%s%s",
			       reg_half_names[reg],
			       is_upper ? "u" : "l");
      }
      break;

    default:
      return PRINT_INSN_ARG_INVALID_OP_TABLE;
    }

  return p - p0;
}